

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_bundle_adjustment.cc
# Opt level: O0

bool calc_cam_poses(Correspondences2D2D *matches,CameraPose *pose1,CameraPose *pose2,float f1,
                   float f2)

{
  double *this;
  pointer *this_00;
  bool bVar1;
  Matrix<double,3,3> *this_01;
  size_type sVar2;
  reference pvVar3;
  const_reference match;
  ulong local_130;
  size_t i;
  bool found_pose;
  undefined1 local_118 [8];
  vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> poses;
  undefined1 local_b8 [8];
  EssentialMatrix E;
  FundamentalMatrix F;
  float f2_local;
  float f1_local;
  CameraPose *pose2_local;
  CameraPose *pose1_local;
  Correspondences2D2D *matches_local;
  
  this = E.m + 8;
  math::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)this);
  sfm::fundamental_least_squares(matches,(FundamentalMatrix *)this);
  sfm::enforce_essential_constraints((EssentialMatrix *)this);
  sfm::CameraPose::set_k_matrix(pose1,(double)f1,0.0,0.0);
  sfm::CameraPose::init_canonical_form(pose1);
  sfm::CameraPose::set_k_matrix(pose2,(double)f2,0.0,0.0);
  this_01 = (Matrix<double,3,3> *)math::Matrix<double,_3,_3>::transpose(&pose2->K);
  this_00 = &poses.super__Vector_base<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  math::Matrix<double,3,3>::operator*
            ((Matrix<double,_3,_3> *)this_00,this_01,(Matrix<double,_3,_3> *)this);
  math::Matrix<double,3,3>::operator*
            ((Matrix<double,_3,_3> *)local_b8,(Matrix<double,3,3> *)this_00,&pose1->K);
  std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::vector
            ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118);
  sfm::pose_from_essential
            ((Matrix<double,_3,_3> *)local_b8,
             (vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118);
  i._3_1_ = false;
  local_130 = 0;
  do {
    sVar2 = std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::size
                      ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118);
    if (sVar2 <= local_130) {
LAB_0010992c:
      std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::~vector
                ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118);
      return i._3_1_;
    }
    pvVar3 = std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::operator[]
                       ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118,
                        local_130);
    math::Matrix<double,_3,_3>::operator=(&pvVar3->K,&pose2->K);
    match = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
            operator[](matches,0);
    pvVar3 = std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::operator[]
                       ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118,
                        local_130);
    bVar1 = sfm::is_consistent_pose(match,pose1,pvVar3);
    if (bVar1) {
      pvVar3 = std::vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::operator[]
                         ((vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)local_118,
                          local_130);
      sfm::CameraPose::operator=(pose2,pvVar3);
      i._3_1_ = true;
      goto LAB_0010992c;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

bool calc_cam_poses(sfm::Correspondences2D2D const &matches
                  , sfm::CameraPose* pose1
                  , sfm::CameraPose* pose2
                  , float f1
                  , float f2)
{
    // calculate fundamental matrix from  pair correspondences
    sfm::FundamentalMatrix F;
    sfm::fundamental_least_squares(matches, &F);
    sfm::enforce_essential_constraints(&F);

    // 设置相机1的内参矩阵
    pose1->set_k_matrix(f1, 0.0, 0.0);
    // 相机1为参考矩阵，将其姿态设置成单位矩阵
    pose1->init_canonical_form();
    pose2->set_k_matrix(f2, 0.0, 0.0);

    // todo 从本征矩阵中计算本质矩阵
    sfm::EssentialMatrix E = pose2->K.transpose()*F*pose1->K;

    // 从本质矩阵中计算相机姿态,一共有四种情况
    std::vector<sfm::CameraPose> poses;
    sfm::pose_from_essential(E, &poses);

    // 利用匹配点对从4中相机姿态中找到最合适的(利用姿态对匹配点进行三角化得到三维点，计算三维点的相机坐标，
    // 在两个相机的中的z坐标必须为正
    bool found_pose=false;
    for(std::size_t i=0; i< poses.size(); ++i){
        poses[i].K = pose2->K;
        if(sfm::is_consistent_pose(matches[0],*pose1, poses[i]))
        {
            *pose2 = poses[i];
            found_pose = true;
            break;
        }
    }
    return found_pose;
}